

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

string * __thiscall
ot::commissioner::Interpreter::BaConnModeToString_abi_cxx11_
          (string *__return_storage_ptr__,Interpreter *this,uint32_t aConnMode)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "disallowed";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "PSKc";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "PSKd";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "vendor";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "X.509";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "reserved";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::BaConnModeToString(uint32_t aConnMode)
{
    switch (aConnMode)
    {
    case 0:
        return "disallowed";
    case 1:
        return "PSKc";
    case 2:
        return "PSKd";
    case 3:
        return "vendor";
    case 4:
        return "X.509";
    default:
        return "reserved";
    }
}